

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyb_parse_value(lys_type *type,lyd_node_leaf_list *leaf,lyd_attr *attr,char *data,
                   unres_data *unres,lyb_state *lybs)

{
  int iVar1;
  uint8_t *local_70;
  uint8_t *value_flags;
  LY_DATA_TYPE *value_type;
  lyd_val *value;
  char **value_str;
  int local_48;
  int iStack_44;
  uint8_t start_byte;
  int ret;
  int r;
  lyb_state *lybs_local;
  unres_data *unres_local;
  char *data_local;
  lyd_attr *attr_local;
  lyd_node_leaf_list *leaf_local;
  lys_type *type_local;
  
  local_48 = 0;
  _ret = lybs;
  lybs_local = (lyb_state *)unres;
  unres_local = (unres_data *)data;
  data_local = (char *)attr;
  attr_local = (lyd_attr *)leaf;
  leaf_local = (lyd_node_leaf_list *)type;
  if (((leaf != (lyd_node_leaf_list *)0x0) || (attr != (lyd_attr *)0x0)) &&
     ((leaf == (lyd_node_leaf_list *)0x0 || (attr == (lyd_attr *)0x0)))) {
    if (leaf == (lyd_node_leaf_list *)0x0) {
      value = (lyd_val *)&attr->value_str;
      value_type = (LY_DATA_TYPE *)&attr->value;
      value_flags = (uint8_t *)&attr->value_type;
      local_70 = &attr->value_flags;
    }
    else {
      value = (lyd_val *)&leaf->value_str;
      value_type = (LY_DATA_TYPE *)&leaf->value;
      value_flags = (uint8_t *)&leaf->value_type;
      local_70 = &leaf->value_flags;
    }
    iStack_44 = lyb_read(data,(uint8_t *)((long)&value_str + 7),1,lybs);
    local_48 = iStack_44 + local_48;
    if (iStack_44 < 0) {
      type_local._4_4_ = -1;
    }
    else {
      unres_local = (unres_data *)((long)&unres_local->node + (long)iStack_44);
      *(uint *)value_flags = value_str._7_1_ & 0x1f;
      if ((value_str._7_1_ & 0x80) != 0) {
        if (attr_local == (lyd_attr *)0x0) {
          __assert_fail("leaf",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                        ,0x2ca,
                        "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                       );
        }
        *(byte *)((long)&attr_local->next + 1) = *(byte *)((long)&attr_local->next + 1) & 0xfe | 1;
      }
      if ((value_str._7_1_ & 0x40) != 0) {
        *local_70 = *local_70 | 2;
      }
      if ((value_str._7_1_ & 0x20) != 0) {
        *local_70 = *local_70 | 1;
      }
      iStack_44 = lyb_parse_val_1((lys_type *)leaf_local,*(LY_DATA_TYPE *)value_flags,*local_70,
                                  (char *)unres_local,&value->binary,(lyd_val *)value_type,_ret);
      local_48 = iStack_44 + local_48;
      if (iStack_44 < 0) {
        type_local._4_4_ = -1;
      }
      else {
        unres_local = (unres_data *)((long)&unres_local->node + (long)iStack_44);
        if ((*(int *)&leaf_local->schema == 0xb) && ((*local_70 & 2) == 0)) {
          if (*(int *)value_flags != 10) {
            __assert_fail("*value_type == LY_TYPE_STRING",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                          ,0x2d9,
                          "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                         );
          }
          value->uint64 = *(undefined8 *)value_type;
          value_type[0] = LY_TYPE_DER;
          value_type[1] = LY_TYPE_DER;
          value_flags[0] = '\v';
          value_flags[1] = '\0';
          value_flags[2] = '\0';
          value_flags[3] = '\0';
        }
        iVar1 = lyb_parse_val_2((lys_type *)leaf_local,(lyd_node_leaf_list *)attr_local,
                                (lyd_attr *)data_local,(unres_data *)lybs_local);
        type_local._4_4_ = iVar1 + local_48;
        if (iVar1 < 0) {
          type_local._4_4_ = -1;
        }
      }
    }
    return type_local._4_4_;
  }
  __assert_fail("(leaf || attr) && (!leaf || !attr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                ,0x2b5,
                "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
               );
}

Assistant:

static int
lyb_parse_value(struct lys_type *type, struct lyd_node_leaf_list *leaf, struct lyd_attr *attr, const char *data,
                struct unres_data *unres, struct lyb_state *lybs)
{
    int r, ret = 0;
    uint8_t start_byte;

    const char **value_str;
    lyd_val *value;
    LY_DATA_TYPE *value_type;
    uint8_t *value_flags;

    assert((leaf || attr) && (!leaf || !attr));

    if (leaf) {
        value_str = &leaf->value_str;
        value = &leaf->value;
        value_type = &leaf->value_type;
        value_flags = &leaf->value_flags;
    } else {
        value_str = &attr->value_str;
        value = &attr->value;
        value_type = &attr->value_type;
        value_flags = &attr->value_flags;
    }

    /* read value type and flags on the first byte */
    ret += (r = lyb_read(data, &start_byte, sizeof start_byte, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* fill value type, flags */
    *value_type = start_byte & 0x1F;
    if (start_byte & 0x80) {
        assert(leaf);
        leaf->dflt = 1;
    }
    if (start_byte & 0x40) {
        *value_flags |= LY_VALUE_USER;
    }
    if (start_byte & 0x20) {
        *value_flags |= LY_VALUE_UNRES;
    }

    ret += (r = lyb_parse_val_1(type, *value_type, *value_flags, data, value_str, value, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* union is handled specially */
    if ((type->base == LY_TYPE_UNION) && !(*value_flags & LY_VALUE_USER)) {
        assert(*value_type == LY_TYPE_STRING);

        *value_str = value->string;
        value->string = NULL;
        *value_type = LY_TYPE_UNION;
    }

    ret += (r = lyb_parse_val_2(type, leaf, attr, unres));
    LYB_HAVE_READ_RETURN(r, data, -1);

    return ret;
}